

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O0

void __thiscall QTextEngine::QTextEngine(QTextEngine *this)

{
  QTextOption *in_RDI;
  QFont *in_stack_00000008;
  
  QList<QScriptLine>::QList((QList<QScriptLine> *)0x82566c);
  FontEngineCache::FontEngineCache((FontEngineCache *)0x82567a);
  QString::QString((QString *)0x825688);
  QFont::QFont(in_stack_00000008);
  QRawFont::QRawFont((QRawFont *)in_RDI);
  QTextBlock::QTextBlock((QTextBlock *)&in_RDI[4].tab);
  QTextOption::QTextOption(in_RDI);
  QFixed::QFixed((QFixed *)(in_RDI + 6));
  QFixed::QFixed((QFixed *)&in_RDI[6].f);
  QPointF::QPointF((QPointF *)&in_RDI[6].tab);
  QList<QTextEngine::ItemDecoration>::QList((QList<QTextEngine::ItemDecoration> *)0x825704);
  QList<QTextEngine::ItemDecoration>::QList((QList<QTextEngine::ItemDecoration> *)0x825715);
  QList<QTextEngine::ItemDecoration>::QList((QList<QTextEngine::ItemDecoration> *)0x825726);
  init((EVP_PKEY_CTX *)in_RDI);
  return;
}

Assistant:

QTextEngine::QTextEngine()
{
    init(this);
}